

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void t1_parse_font_matrix(T1_Face face,T1_Loader loader)

{
  FT_Bool FVar1;
  FT_Int FVar2;
  FT_Long FVar3;
  long b_;
  undefined1 auVar4 [16];
  FT_Fixed temp [6];
  
  FVar2 = (*(loader->parser).root.funcs.to_fixed_array)((PS_Parser)loader,6,temp,3);
  if (5 < FVar2) {
    b_ = -temp[3];
    if (0 < temp[3]) {
      b_ = temp[3];
    }
    if (temp[3] != 0) {
      if (b_ != 0x10000) {
        FVar3 = FT_DivFix(1000,b_);
        (face->root).units_per_EM = (FT_UShort)FVar3;
        temp[0] = FT_DivFix(temp[0],b_);
        temp[1] = FT_DivFix(temp[1],b_);
        temp[2] = FT_DivFix(temp[2],b_);
        temp[4] = FT_DivFix(temp[4],b_);
        temp[5] = FT_DivFix(temp[5],b_);
        temp[3] = (ulong)(-1 < temp[3]) * 0x20000 + -0x10000;
      }
      (face->type1).font_matrix.xx = temp[0];
      auVar4._8_4_ = (int)temp[1];
      auVar4._0_8_ = temp[2];
      auVar4._12_4_ = (int)((ulong)temp[1] >> 0x20);
      (face->type1).font_matrix.xy = temp[2];
      (face->type1).font_matrix.yx = auVar4._8_8_;
      (face->type1).font_matrix.yy = temp[3];
      FVar1 = FT_Matrix_Check(&(face->type1).font_matrix);
      if (FVar1 != '\0') {
        (face->type1).font_offset.x = CONCAT44((int)(temp[4] >> 0x30),(int)((ulong)temp[4] >> 0x10))
        ;
        *(int *)&(face->type1).font_bbox.xMin = (int)((ulong)temp[5] >> 0x10);
        *(int *)((long)&(face->type1).font_bbox.xMin + 4) = (int)(temp[5] >> 0x30);
        return;
      }
    }
  }
  (loader->parser).root.error = 3;
  return;
}

Assistant:

static void
  t1_parse_font_matrix( T1_Face    face,
                        T1_Loader  loader )
  {
    T1_Parser   parser = &loader->parser;
    FT_Matrix*  matrix = &face->type1.font_matrix;
    FT_Vector*  offset = &face->type1.font_offset;
    FT_Face     root   = (FT_Face)&face->root;
    FT_Fixed    temp[6];
    FT_Fixed    temp_scale;
    FT_Int      result;


    /* input is scaled by 1000 to accommodate default FontMatrix */
    result = T1_ToFixedArray( parser, 6, temp, 3 );

    if ( result < 6 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    FT_TRACE4(( " [%f %f %f %f %f %f]\n",
                (double)temp[0] / 65536 / 1000,
                (double)temp[1] / 65536 / 1000,
                (double)temp[2] / 65536 / 1000,
                (double)temp[3] / 65536 / 1000,
                (double)temp[4] / 65536 / 1000,
                (double)temp[5] / 65536 / 1000 ));

    temp_scale = FT_ABS( temp[3] );

    if ( temp_scale == 0 )
    {
      FT_ERROR(( "t1_parse_font_matrix: invalid font matrix\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* atypical case */
    if ( temp_scale != 0x10000L )
    {
      /* set units per EM based on FontMatrix values */
      root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

      temp[0] = FT_DivFix( temp[0], temp_scale );
      temp[1] = FT_DivFix( temp[1], temp_scale );
      temp[2] = FT_DivFix( temp[2], temp_scale );
      temp[4] = FT_DivFix( temp[4], temp_scale );
      temp[5] = FT_DivFix( temp[5], temp_scale );
      temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
    }
    matrix->xx = temp[0];
    matrix->yx = temp[1];
    matrix->xy = temp[2];
    matrix->yy = temp[3];

    if ( !FT_Matrix_Check( matrix ) )
    {
      FT_ERROR(( "t1_parse_font_matrix: invalid font matrix\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* note that the offsets must be expressed in integer font units */
    offset->x = temp[4] >> 16;
    offset->y = temp[5] >> 16;
  }